

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProtocolIPv4.cpp
# Opt level: O1

void __thiscall
ProtocolIPv4::Transmit
          (ProtocolIPv4 *this,DataBuffer *buffer,uint8_t protocol,uint8_t *targetIP,
          uint8_t *sourceIP)

{
  uint8_t *puVar1;
  _func_int *UNRECOVERED_JUMPTABLE;
  uint16_t uVar2;
  uint8_t *puVar3;
  
  puVar1 = buffer->Packet;
  puVar3 = puVar1 + -0x14;
  buffer->Packet = puVar3;
  buffer->Length = buffer->Length + 0x14;
  puVar1[-0x14] = 'E';
  puVar1[-0x13] = '\0';
  Pack16(puVar3,2,buffer->Length);
  uVar2 = (short)*(undefined4 *)this + 1;
  this->PacketID = uVar2;
  Pack16(puVar3,4,uVar2);
  puVar1[-0xe] = '\0';
  puVar1[-0xd] = '\0';
  puVar1[-0xc] = ' ';
  puVar1[-0xb] = protocol;
  Pack16(puVar3,10,0);
  PackBytes(puVar3,0xc,sourceIP,4);
  PackBytes(puVar3,0x10,targetIP,4);
  uVar2 = FCS::Checksum(puVar3,0x14);
  Pack16(puVar3,10,uVar2);
  puVar3 = ProtocolARP::Protocol2Hardware(this->ARP,targetIP);
  if (puVar3 != (uint8_t *)0x0) {
    UNRECOVERED_JUMPTABLE = this->MAC->_vptr_InterfaceMAC[10];
    (*UNRECOVERED_JUMPTABLE)(this->MAC,buffer,puVar3,0x800,UNRECOVERED_JUMPTABLE);
    return;
  }
  osQueue::Put(&this->UnresolvedQueue,buffer);
  return;
}

Assistant:

void ProtocolIPv4::Transmit(DataBuffer* buffer,
                            uint8_t protocol,
                            const uint8_t* targetIP,
                            const uint8_t* sourceIP)
{
    uint16_t checksum;
    const uint8_t* targetMAC;
    uint8_t* packet;

    buffer->Packet -= header_size();
    buffer->Length += header_size();
    packet = buffer->Packet;

    packet[0] = 0x45; // Version and HeaderSize
    packet[1] = 0;    // ToS
    Pack16(packet, 2, buffer->Length);

    PacketID++;
    Pack16(packet, 4, PacketID);
    packet[6] = 0; // Flags & FragmentOffset
    packet[7] = 0; // rest of FragmentOffset

    packet[8] = 32; // TTL
    packet[9] = protocol;
    Pack16(packet, 10, 0); // checksum placeholder
    PackBytes(packet, 12, sourceIP, 4);
    PackBytes(packet, 16, targetIP, 4);

    checksum = FCS::Checksum(packet, 20);
    Pack16(packet, 10, checksum);

    targetMAC = ARP.Protocol2Hardware(targetIP);
    if (targetMAC != nullptr)
    {
        MAC.Transmit(buffer, targetMAC, 0x0800);
    }
    else
    {
        // Could not find MAC address, ARP for it
        UnresolvedQueue.Put(buffer);
    }
}